

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::TupleTypename::TupleTypename
          (TupleTypename *this,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *elementTypenames,Token *paren)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer pTVar4;
  undefined4 extraout_var;
  string local_208 [32];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *local_1e8;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *elementTypename;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *__range1;
  string separator;
  ostringstream local_198 [8];
  ostringstream name;
  Token *paren_local;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *elementTypenames_local;
  TupleTypename *this_local;
  
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__TupleTypename_0016a990;
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::vector(&this->m_elementTypenames,elementTypenames);
  Token::Token(&this->m_paren,paren);
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::string::string((string *)&__range1);
  std::operator<<((ostream *)local_198,'(');
  __end1 = std::
           vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ::begin(&this->m_elementTypenames);
  elementTypename =
       (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
       std::
       vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       ::end(&this->m_elementTypenames);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                                *)&elementTypename);
    if (!bVar1) break;
    local_1e8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)local_198,(string *)&__range1);
    pTVar4 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(local_1e8);
    iVar2 = (*pTVar4->_vptr_Typename[4])();
    std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::operator=((string *)&__range1,", ");
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)local_198,')');
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_name,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

TupleTypename::TupleTypename(std::vector<std::unique_ptr<const Typename>> elementTypenames, Token paren) :
            m_elementTypenames{std::move(elementTypenames)},
            m_paren{std::move(paren)} {
        std::ostringstream name;
        std::string separator;

        name << '(';
        for (const auto& elementTypename : m_elementTypenames) {
            name << separator << elementTypename->name();
            separator = ", ";
        }
        name << ')';

        m_name = name.str();
    }